

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

Int __thiscall ipx::LpSolver::GetBasis(LpSolver *this,Int *cbasis,Int *vbasis)

{
  Basis *this_00;
  bool bVar1;
  Int IVar2;
  Model *pMVar3;
  ulong uVar4;
  ulong uVar5;
  size_type __n;
  allocator_type local_61;
  Int *local_60;
  Int *local_58;
  vector<int,_std::allocator<int>_> basic_statuses;
  
  this_00 = (this->basis_)._M_t.super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>.
            _M_t.super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
            super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl;
  if (this_00 == (Basis *)0x0) {
    IVar2 = -1;
  }
  else {
    local_60 = vbasis;
    local_58 = cbasis;
    if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pMVar3 = Basis::model(this_00);
      __n = (long)pMVar3->num_cols_ + (long)pMVar3->num_rows_;
      std::vector<int,_std::allocator<int>_>::vector(&basic_statuses,__n,&local_61);
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (int)__n) {
        uVar4 = __n & 0xffffffff;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        bVar1 = Basis::IsBasic(this_00,(Int)uVar5);
        if (bVar1) {
          basic_statuses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = 0;
        }
        else if ((ulong)ABS((pMVar3->lb_)._M_data[uVar5]) < 0x7ff0000000000000) {
          basic_statuses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = -1;
        }
        else if ((ulong)ABS((pMVar3->ub_)._M_data[uVar5]) < 0x7ff0000000000000) {
          basic_statuses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = -2;
        }
        else {
          basic_statuses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = -3;
        }
      }
      Model::PostsolveBasis(&this->model_,&basic_statuses,local_58,local_60);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&basic_statuses.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      Model::PostsolveBasis(&this->model_,&this->basic_statuses_,cbasis,vbasis);
    }
    IVar2 = 0;
  }
  return IVar2;
}

Assistant:

Int LpSolver::GetBasis(Int* cbasis, Int* vbasis) {
    if (!basis_)
        return -1;
    if (!basic_statuses_.empty()) {
        // crossover provides basic statuses
        model_.PostsolveBasis(basic_statuses_, cbasis, vbasis);
    } else {
        model_.PostsolveBasis(BuildBasicStatuses(*basis_), cbasis, vbasis);
    }
    return 0;
}